

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O1

void __thiscall Controller::addViewPattern(Controller *this,string *name,View *view)

{
  ViewPattern temp;
  ViewPattern local_30;
  
  ViewPattern::ViewPattern(&local_30,name,view);
  std::vector<ViewPattern,_std::allocator<ViewPattern>_>::push_back(&views_list,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.name._M_dataplus._M_p != &local_30.name.field_2) {
    operator_delete(local_30.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Controller::addViewPattern(const string &name, View *view) {
    ViewPattern temp = ViewPattern(name, view);
    views_list.push_back(temp);
}